

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

TestName * ApprovalTests::ApprovalTestNamer::getCurrentTest(void)

{
  TestName *pTVar1;
  string helpMessage;
  runtime_error *anon_var_0;
  TestName *in_stack_ffffffffffffffd0;
  
  pTVar1 = currentTest(in_stack_ffffffffffffffd0);
  return pTVar1;
}

Assistant:

TestName& ApprovalTestNamer::getCurrentTest()
    {
        try
        {
            return currentTest();
        }
        catch (const std::runtime_error&)
        {
            std::string helpMessage = getMisconfiguredMainHelp();
            throw std::runtime_error(helpMessage);
        }
    }